

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O0

KBOOL __thiscall KDIS::DATA_TYPE::IFF_Layer2::operator==(IFF_Layer2 *this,IFF_Layer2 *Value)

{
  KBOOL KVar1;
  bool bVar2;
  IFF_Layer2 *Value_local;
  IFF_Layer2 *this_local;
  
  KVar1 = LayerHeader::operator!=(&this->super_LayerHeader,&Value->super_LayerHeader);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = BeamData::operator!=(&this->m_BmDt,&Value->m_BmDt);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = SecondaryOperationalData::operator!=(&this->m_SOD,&Value->m_SOD);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        bVar2 = std::operator!=(&this->m_vFPD,&Value->m_vFPD);
        if (bVar2) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL IFF_Layer2::operator == ( const IFF_Layer2 & Value ) const
{
    if( LayerHeader::operator !=( Value ) )     return false;    
    if( m_BmDt                != Value.m_BmDt ) return false;
    if( m_SOD                 != Value.m_SOD )  return false;
	if( m_vFPD                != Value.m_vFPD ) return false;
    return true;
}